

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O0

bool FetchAndClearCommitmentSection
               (Span<const_unsigned_char> header,CScript *witness_commitment,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *result)

{
  iterator x;
  span<const_unsigned_char,_18446744073709551615UL> b;
  const_iterator __last;
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last_00;
  size_type sVar2;
  uchar *puVar3;
  CScript *in_RCX;
  long in_FS_OFFSET;
  bool found_header;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pushdata;
  const_iterator pc;
  opcodetype opcode;
  CScript replacement;
  Span<const_unsigned_char> *in_stack_fffffffffffffe78;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffe98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffea0;
  CScript *in_stack_fffffffffffffea8;
  iterator in_stack_fffffffffffffeb0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  const_iterator in_stack_fffffffffffffec8;
  bool local_12a;
  iterator in_stack_fffffffffffffee0;
  iterator in_stack_fffffffffffffee8;
  byte local_e1;
  Span<unsigned_char> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_fffffffffffffe78);
  local_e1 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78);
  __last_00._M_current =
       (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffe80);
  x.ptr._7_1_ = in_stack_fffffffffffffe8f;
  x.ptr._0_7_ = in_stack_fffffffffffffe88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::const_iterator
            ((const_iterator *)in_stack_fffffffffffffe80,x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78);
  while (bVar1 = CScript::GetOp(in_stack_fffffffffffffea8,
                                (const_iterator *)in_stack_fffffffffffffea0,
                                (opcodetype *)in_stack_fffffffffffffe98._M_current,
                                in_stack_fffffffffffffe90), bVar1) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffe78);
    if (sVar2 == 0) {
      CScript::operator<<((CScript *)in_stack_fffffffffffffeb0._M_current,
                          (opcodetype)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    }
    else {
      local_12a = false;
      if (local_e1 == 0) {
        in_stack_fffffffffffffec8._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffe78);
        puVar3 = (uchar *)Span<const_unsigned_char>::size(in_stack_fffffffffffffe78);
        local_12a = false;
        if (puVar3 < in_stack_fffffffffffffec8._M_current) {
          Span<unsigned_char>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<unsigned_char> *)
                     CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          in_stack_fffffffffffffeb8._M_extent_value = (size_t)local_38;
          Span<const_unsigned_char>::size(in_stack_fffffffffffffe78);
          local_70 = Span<unsigned_char>::first
                               ((Span<unsigned_char> *)
                                CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                                (size_t)in_stack_fffffffffffffe80);
          in_stack_fffffffffffffec7 =
               std::ranges::__equal_fn::
               operator()<Span<unsigned_char>,_const_Span<const_unsigned_char>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                         ((__equal_fn *)&std::ranges::equal,&local_70,
                          in_stack_fffffffffffffeb8._M_extent_value);
          local_12a = (bool)in_stack_fffffffffffffec7;
        }
      }
      if (local_12a != false) {
        in_stack_fffffffffffffea8 = in_RCX;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe80);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe80);
        in_stack_fffffffffffffea0 = &local_60;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe80);
        Span<const_unsigned_char>::size(in_stack_fffffffffffffe78);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                    (difference_type)in_stack_fffffffffffffe80);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe80);
        in_stack_fffffffffffffeb0 =
             std::vector<unsigned_char,std::allocator<unsigned_char>>::
             insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffee8._M_current,
                        in_stack_fffffffffffffee0._M_current,__last_00);
        in_stack_fffffffffffffe90 = &local_60;
        in_stack_fffffffffffffee8 = in_stack_fffffffffffffeb0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe80);
        Span<const_unsigned_char>::size(in_stack_fffffffffffffe78);
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                    (difference_type)in_stack_fffffffffffffe80);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe80);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe80);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffe80);
        __last._M_current._7_1_ = in_stack_fffffffffffffec7;
        __last._M_current._0_7_ = in_stack_fffffffffffffec0;
        in_stack_fffffffffffffe98 =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffec8,__last);
        local_e1 = 1;
        in_stack_fffffffffffffee0 = in_stack_fffffffffffffe98;
      }
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe80)
      ;
      b._M_extent._M_extent_value = in_stack_fffffffffffffeb8._M_extent_value;
      b._M_ptr = in_stack_fffffffffffffeb0._M_current;
      CScript::operator<<((CScript *)in_stack_fffffffffffffe98._M_current,b);
    }
  }
  if (local_e1 != 0) {
    CScript::operator=((CScript *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                       (CScript *)in_stack_fffffffffffffe80);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(local_e1,in_stack_fffffffffffffe88));
  CScript::~CScript((CScript *)in_stack_fffffffffffffe78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_e1 & 1);
}

Assistant:

static bool FetchAndClearCommitmentSection(const Span<const uint8_t> header, CScript& witness_commitment, std::vector<uint8_t>& result)
{
    CScript replacement;
    bool found_header = false;
    result.clear();

    opcodetype opcode;
    CScript::const_iterator pc = witness_commitment.begin();
    std::vector<uint8_t> pushdata;
    while (witness_commitment.GetOp(pc, opcode, pushdata)) {
        if (pushdata.size() > 0) {
            if (!found_header && pushdata.size() > header.size() && std::ranges::equal(Span{pushdata}.first(header.size()), header)) {
                // pushdata only counts if it has the header _and_ some data
                result.insert(result.end(), pushdata.begin() + header.size(), pushdata.end());
                pushdata.erase(pushdata.begin() + header.size(), pushdata.end());
                found_header = true;
            }
            replacement << pushdata;
        } else {
            replacement << opcode;
        }
    }

    if (found_header) witness_commitment = replacement;
    return found_header;
}